

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

char * curl_pushheader_byname(curl_pushheaders *h,char *header)

{
  Curl_easy *pCVar1;
  HTTP *pHVar2;
  size_t sVar3;
  char **ppcVar4;
  int iVar5;
  char *pcVar6;
  size_t __n;
  size_t sVar7;
  
  if ((h != (curl_pushheaders *)0x0) && (pCVar1 = h->data, pCVar1 != (Curl_easy *)0x0)) {
    if (header == (char *)0x0) {
      return (char *)0x0;
    }
    if (pCVar1->magic != 0xc0dedbad) {
      return (char *)0x0;
    }
    if (((*header != '\0') && (iVar5 = strcmp(header,":"), iVar5 != 0)) &&
       (pcVar6 = strchr(header + 1,0x3a), pcVar6 == (char *)0x0)) {
      pHVar2 = (pCVar1->req).p.http;
      __n = strlen(header);
      sVar3 = pHVar2->push_headers_used;
      if (sVar3 != 0) {
        ppcVar4 = pHVar2->push_headers;
        sVar7 = 0;
        while( true ) {
          pcVar6 = ppcVar4[sVar7];
          iVar5 = strncmp(header,pcVar6,__n);
          if ((iVar5 == 0) && (pcVar6[__n] == ':')) break;
          sVar7 = sVar7 + 1;
          if (sVar3 == sVar7) {
            return (char *)0x0;
          }
        }
        return pcVar6 + __n + 1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *curl_pushheader_byname(struct curl_pushheaders *h, const char *header)
{
  /* Verify that we got a good easy handle in the push header struct,
     mostly to detect rubbish input fast(er). Also empty header name
     is just a rubbish too. We have to allow ":" at the beginning of
     the header, but header == ":" must be rejected. If we have ':' in
     the middle of header, it could be matched in middle of the value,
     this is because we do prefix match.*/
  if(!h || !GOOD_EASY_HANDLE(h->data) || !header || !header[0] ||
     !strcmp(header, ":") || strchr(header + 1, ':'))
    return NULL;
  else {
    struct HTTP *stream = h->data->req.p.http;
    size_t len = strlen(header);
    size_t i;
    for(i = 0; i<stream->push_headers_used; i++) {
      if(!strncmp(header, stream->push_headers[i], len)) {
        /* sub-match, make sure that it is followed by a colon */
        if(stream->push_headers[i][len] != ':')
          continue;
        return &stream->push_headers[i][len + 1];
      }
    }
  }
  return NULL;
}